

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

size_t ma_dr_wav_read_raw(ma_dr_wav *pWav,size_t bytesToRead,void *pBufferOut)

{
  ma_bool32 mVar1;
  size_t sVar2;
  void *in_RDX;
  ulong in_RSI;
  ma_dr_wav *in_RDI;
  size_t bytesToSeek_1;
  size_t bytesSeeked;
  ma_uint8 buffer [4096];
  size_t bytesToSeek;
  ma_uint32 bytesPerFrame;
  size_t bytesRead;
  ulong local_1048;
  undefined1 local_1038 [4096];
  ulong local_38;
  ma_uint32 local_2c;
  ulong local_28;
  void *local_20;
  ulong local_18;
  ma_dr_wav *local_10;
  size_t local_8;
  
  if ((in_RDI == (ma_dr_wav *)0x0) || (in_RSI == 0)) {
    local_8 = 0;
  }
  else {
    local_18 = in_RSI;
    if (in_RDI->bytesRemaining < in_RSI) {
      local_18 = in_RDI->bytesRemaining;
    }
    if (local_18 == 0) {
      local_8 = 0;
    }
    else {
      local_20 = in_RDX;
      local_10 = in_RDI;
      local_2c = ma_dr_wav_get_bytes_per_pcm_frame(in_RDI);
      if (local_2c == 0) {
        local_8 = 0;
      }
      else {
        if (local_20 == (void *)0x0) {
          for (local_28 = 0; local_28 < local_18; local_28 = local_38 + local_28) {
            local_38 = local_18 - local_28;
            if (0x7fffffff < local_38) {
              local_38 = 0x7fffffff;
            }
            mVar1 = (*local_10->onSeek)(local_10->pUserData,(int)local_38,
                                        ma_dr_wav_seek_origin_current);
            if (mVar1 == 0) break;
          }
          do {
            if (local_18 <= local_28) break;
            local_1048 = local_18 - local_28;
            if (0x1000 < local_1048) {
              local_1048 = 0x1000;
            }
            sVar2 = (*local_10->onRead)(local_10->pUserData,local_1038,local_1048);
            local_28 = sVar2 + local_28;
          } while (local_1048 <= sVar2);
        }
        else {
          local_28 = (*local_10->onRead)(local_10->pUserData,local_20,local_18);
        }
        local_10->readCursorInPCMFrames = local_28 / local_2c + local_10->readCursorInPCMFrames;
        local_10->bytesRemaining = local_10->bytesRemaining - local_28;
        local_8 = local_28;
      }
    }
  }
  return local_8;
}

Assistant:

MA_API size_t ma_dr_wav_read_raw(ma_dr_wav* pWav, size_t bytesToRead, void* pBufferOut)
{
    size_t bytesRead;
    ma_uint32 bytesPerFrame;
    if (pWav == NULL || bytesToRead == 0) {
        return 0;
    }
    if (bytesToRead > pWav->bytesRemaining) {
        bytesToRead = (size_t)pWav->bytesRemaining;
    }
    if (bytesToRead == 0) {
        return 0;
    }
    bytesPerFrame = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
    if (bytesPerFrame == 0) {
        return 0;
    }
    if (pBufferOut != NULL) {
        bytesRead = pWav->onRead(pWav->pUserData, pBufferOut, bytesToRead);
    } else {
        bytesRead = 0;
        while (bytesRead < bytesToRead) {
            size_t bytesToSeek = (bytesToRead - bytesRead);
            if (bytesToSeek > 0x7FFFFFFF) {
                bytesToSeek = 0x7FFFFFFF;
            }
            if (pWav->onSeek(pWav->pUserData, (int)bytesToSeek, ma_dr_wav_seek_origin_current) == MA_FALSE) {
                break;
            }
            bytesRead += bytesToSeek;
        }
        while (bytesRead < bytesToRead) {
            ma_uint8 buffer[4096];
            size_t bytesSeeked;
            size_t bytesToSeek = (bytesToRead - bytesRead);
            if (bytesToSeek > sizeof(buffer)) {
                bytesToSeek = sizeof(buffer);
            }
            bytesSeeked = pWav->onRead(pWav->pUserData, buffer, bytesToSeek);
            bytesRead += bytesSeeked;
            if (bytesSeeked < bytesToSeek) {
                break;
            }
        }
    }
    pWav->readCursorInPCMFrames += bytesRead / bytesPerFrame;
    pWav->bytesRemaining -= bytesRead;
    return bytesRead;
}